

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

test_suite * init_unit_test_suite(int param_1,char **param_2)

{
  char *pcVar1;
  test_suite *this;
  BufferTestSuite *this_00;
  const_string local_38;
  const_string local_28;
  
  this = (test_suite *)operator_new(0x180);
  local_38.m_begin = "Buffer Unit Tests";
  local_38.m_end = "";
  local_28.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_28.m_end = "";
  do {
    pcVar1 = local_28.m_end + 1;
    local_28.m_end = local_28.m_end + 1;
  } while (*pcVar1 != '\0');
  boost::unit_test::test_suite::test_suite(this,&local_38,&local_28,0x47c);
  this_00 = (BufferTestSuite *)operator_new(0x180);
  BufferTestSuite::BufferTestSuite(this_00);
  boost::unit_test::test_suite::add(this,&(this_00->super_test_suite).super_test_unit,0,0);
  return this;
}

Assistant:

boost::unit_test::test_suite*
init_unit_test_suite( int, char* [] ) 
{
    boost::unit_test::test_suite *test (BOOST_TEST_SUITE ("Buffer Unit Tests"));
    test->add (new BufferTestSuite() );

    return test;
}